

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::Logger::initUnflushedCount(Logger *this)

{
  function<bool_()> *in_RDI;
  EnumType lIndex;
  EnumType *startIndex;
  function<bool_()> *in_stack_ffffffffffffffb0;
  anon_class_16_2_455e6bc1 local_30 [2];
  EnumType local_c [3];
  
  el::base::utils::std::
  unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::clear((unordered_map<el::Level,_unsigned_int,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
           *)0x2275ee);
  local_c[0] = 2;
  startIndex = local_c;
  std::function<bool()>::function<el::Logger::initUnflushedCount()::__0,void>
            (in_stack_ffffffffffffffb0,local_30);
  LevelHelper::forEachLevel(startIndex,in_RDI);
  el::base::utils::std::function<bool_()>::~function((function<bool_()> *)0x22763d);
  return;
}

Assistant:

void Logger::initUnflushedCount(void) {
  m_unflushedCount.clear();
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    m_unflushedCount.insert(std::make_pair(LevelHelper::castFromInt(lIndex), 0));
    return false;
  });
}